

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O3

RSA * createPrivateRSA(string *key)

{
  BIO *bp;
  RSA *rsa;
  RSA *local_18;
  
  local_18 = (RSA *)0x0;
  bp = BIO_new_mem_buf((key->_M_dataplus)._M_p,-1);
  if (bp == (BIO *)0x0) {
    local_18 = (RSA *)0x0;
  }
  else {
    local_18 = PEM_read_bio_RSAPrivateKey(bp,&local_18,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
  }
  return (RSA *)local_18;
}

Assistant:

RSA* createPrivateRSA(const std::string &key) {
  RSA *rsa = NULL;
  const char* c_string = key.c_str();
  BIO * keybio = BIO_new_mem_buf(reinterpret_cast<const void*>(c_string), -1);
  if (keybio == NULL) { return NULL; }
  rsa = PEM_read_bio_RSAPrivateKey(keybio,
                                   &rsa,
                                   NULL,
                                   NULL);
  BIO_free(keybio);
  return rsa;
}